

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

int gladLoadGL(void)

{
  bool bVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = 0;
  bVar5 = true;
  pvVar2 = libGL;
  while (libGL = pvVar2,
        libGL = (void *)dlopen((long)&open_gl_NAMES_rel + (long)(int)(&open_gl_NAMES_rel)[lVar4],
                               0x102), libGL == (void *)0x0) {
    lVar4 = 1;
    bVar1 = !bVar5;
    bVar5 = false;
    pvVar2 = (void *)0x0;
    if (bVar1) {
      return 0;
    }
  }
  gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
  if (gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
    return 0;
  }
  iVar3 = gladLoadGLLoader(get_proc);
  if (libGL == (void *)0x0) {
    return iVar3;
  }
  dlclose();
  libGL = (void *)0x0;
  return iVar3;
}

Assistant:

int gladLoadGL(void) {
    int status = 0;

    if(open_gl()) {
        status = gladLoadGLLoader(&get_proc);
        close_gl();
    }

    return status;
}